

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _context.cpp
# Opt level: O0

uint16_t __thiscall r_exec::_Context::setTimestampResult(_Context *this,uint64_t t)

{
  uint16_t index;
  Overlay *this_00;
  vector<r_code::Atom,_std::allocator<r_code::Atom>_> *this_01;
  size_t sVar1;
  Atom *pAVar2;
  ushort uVar3;
  uint16_t value_index;
  Atom local_1c [4];
  uint64_t local_18;
  uint64_t t_local;
  _Context *this_local;
  
  this_00 = this->overlay;
  index = this->index;
  local_18 = t;
  t_local = (uint64_t)this;
  r_code::vector<r_code::Atom>::size(&this_00->values);
  r_code::Atom::ValuePointer((ushort)local_1c);
  Overlay::patch_code(this_00,index,local_1c);
  r_code::Atom::~Atom(local_1c);
  this_01 = r_code::vector<r_code::Atom>::as_std(&this->overlay->values);
  sVar1 = r_code::vector<r_code::Atom>::size(&this->overlay->values);
  std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::resize(this_01,sVar1 + 3);
  sVar1 = r_code::vector<r_code::Atom>::size(&this->overlay->values);
  uVar3 = (short)sVar1 - 3;
  pAVar2 = r_code::vector<r_code::Atom>::operator[](&this->overlay->values,(ulong)uVar3);
  r_code::Utils::SetTimestamp(pAVar2,local_18);
  return uVar3;
}

Assistant:

uint16_t _Context::setTimestampResult(uint64_t t) const   // patch code with a VALUE_PTR
{
    overlay->patch_code(index, Atom::ValuePointer(overlay->values.size()));
    overlay->values.as_std()->resize(overlay->values.size() + 3);
    uint16_t value_index = overlay->values.size() - 3;
    Utils::SetTimestamp(&overlay->values[value_index], t);
    return value_index;
}